

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IRBuilder.cpp
# Opt level: O2

void __thiscall
IRBuilder::BuildElementC
          (IRBuilder *this,OpCode newOpcode,uint32 offset,RegSlot fieldRegSlot,RegSlot regSlot,
          PropertyIdIndexType propertyIdIndex)

{
  code *pcVar1;
  bool bVar2;
  PropertyId propertyId;
  uint uVar3;
  JITTimeFunctionBody *this_00;
  SymOpnd *pSVar4;
  SymOpnd *src1Opnd;
  SymOpnd *dstOpnd;
  Instr *instr;
  undefined4 *puVar5;
  Func *func;
  undefined6 in_register_00000032;
  int iVar6;
  
  this_00 = Func::GetJITFunctionBody(this->m_func);
  propertyId = JITTimeFunctionBody::GetReferencedPropertyId(this_00,propertyIdIndex);
  bVar2 = false;
  iVar6 = (int)CONCAT62(in_register_00000032,newOpcode);
  pSVar4 = BuildFieldOpnd(this,newOpcode,fieldRegSlot,propertyId,propertyIdIndex,PropertyKindData,
                          0xffffffff);
  uVar3 = iVar6 - 0x118;
  if (uVar3 < 0x40) {
    if ((0x8c00000000000003U >> ((ulong)uVar3 & 0x3f) & 1) == 0) {
      if ((ulong)uVar3 != 0x16) goto LAB_004949f4;
      bVar2 = true;
      newOpcode = DeleteFld;
      goto LAB_004949fd;
    }
  }
  else {
LAB_004949f4:
    if (iVar6 - 0x80U < 4) {
LAB_004949fd:
      dstOpnd = (SymOpnd *)BuildDstOpnd(this,regSlot,TyVar,false,bVar2);
      func = this->m_func;
      src1Opnd = pSVar4;
      goto LAB_00494a1f;
    }
    if (iVar6 != 0xc2) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar5 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IRBuilder.cpp"
                         ,0xd1e,"((0))","Unknown ElementC opcode");
      if (bVar2) {
        *puVar5 = 0;
        Js::Throw::FatalInternalError(-0x7fffbffb);
      }
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
  }
  src1Opnd = (SymOpnd *)BuildSrcOpnd(this,regSlot,TyVar);
  func = this->m_func;
  dstOpnd = pSVar4;
LAB_00494a1f:
  instr = IR::Instr::New(newOpcode,&dstOpnd->super_Opnd,&src1Opnd->super_Opnd,func);
  AddInstr(this,instr,offset);
  return;
}

Assistant:

void
IRBuilder::BuildElementC(Js::OpCode newOpcode, uint32 offset, Js::RegSlot fieldRegSlot, Js::RegSlot regSlot, Js::PropertyIdIndexType propertyIdIndex)
{
    IR::Instr *     instr;
    Js::PropertyId  propertyId = m_func->GetJITFunctionBody()->GetReferencedPropertyId(propertyIdIndex);
    PropertyKind    propertyKind = PropertyKindData;
    IR::SymOpnd *   fieldSymOpnd = this->BuildFieldOpnd(newOpcode, fieldRegSlot, propertyId, propertyIdIndex, propertyKind);
    IR::RegOpnd * regOpnd;
    bool            reuseLoc = false;

    switch (newOpcode)
    {
    case Js::OpCode::DeleteFld_ReuseLoc:
        newOpcode = Js::OpCode::DeleteFld;
        reuseLoc = true;
        // fall through
    case Js::OpCode::DeleteFld:
    case Js::OpCode::DeleteRootFld:
    case Js::OpCode::DeleteFldStrict:
    case Js::OpCode::DeleteRootFldStrict:
        // Load
        regOpnd = this->BuildDstOpnd(regSlot, TyVar, false, reuseLoc);
        instr = IR::Instr::New(newOpcode, regOpnd, fieldSymOpnd, m_func);
        break;

    case Js::OpCode::InitSetFld:
    case Js::OpCode::InitGetFld:
    case Js::OpCode::InitClassMemberGet:
    case Js::OpCode::InitClassMemberSet:
    case Js::OpCode::InitProto:
    case Js::OpCode::StFuncExpr:
        // Store
        regOpnd = this->BuildSrcOpnd(regSlot);
        instr = IR::Instr::New(newOpcode, fieldSymOpnd, regOpnd, m_func);
        break;

    default:
        AssertMsg(UNREACHED, "Unknown ElementC opcode");
        Fatal();
    }

    this->AddInstr(instr, offset);
}